

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

int read_inter_segment_id(AV1_COMMON *cm,MACROBLOCKD *xd,int preskip,aom_reader *r)

{
  MB_MODE_INFO *pMVar1;
  uint8_t *puVar2;
  int iVar3;
  uint uVar4;
  int skip;
  ulong uVar5;
  uint y_mis;
  ulong uVar6;
  uint8_t *puVar7;
  uint x_mis;
  int mi_offset;
  long lVar8;
  bool bVar9;
  
  pMVar1 = *xd->mi;
  iVar3 = (cm->mi_params).mi_cols;
  x_mis = iVar3 - xd->mi_col;
  if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [pMVar1->bsize] <= (int)x_mis) {
    x_mis = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [pMVar1->bsize];
  }
  y_mis = (cm->mi_params).mi_rows - xd->mi_row;
  if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [pMVar1->bsize] <= (int)y_mis) {
    y_mis = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [pMVar1->bsize];
  }
  if ((cm->seg).enabled == '\0') {
    return 0;
  }
  mi_offset = xd->mi_row * iVar3 + xd->mi_col;
  if ((cm->seg).update_map == '\0') {
    puVar2 = cm->last_frame_seg_map;
    uVar6 = 0;
    if (0 < (int)y_mis) {
      uVar6 = (ulong)y_mis;
    }
    puVar7 = cm->cur_frame->seg_map;
    lVar8 = (long)mi_offset;
    if (puVar2 == (uint8_t *)0x0) {
      puVar7 = puVar7 + lVar8;
      while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
        memset(puVar7,0,(long)(int)x_mis);
        puVar7 = puVar7 + iVar3;
      }
    }
    else {
      while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
        memcpy(puVar7 + lVar8,puVar2 + lVar8,(long)(int)x_mis);
        lVar8 = lVar8 + iVar3;
      }
    }
    iVar3 = get_predicted_segment_id(cm,mi_offset,x_mis,y_mis);
    return iVar3;
  }
  if (preskip == 0) {
    if (pMVar1->skip_txfm == '\0') goto LAB_00170ecc;
    if ((cm->seg).temporal_update != '\0') {
      pMVar1->field_0xa7 = pMVar1->field_0xa7 & 0xf7;
    }
    skip = 1;
  }
  else {
    if ((cm->seg).segid_preskip == '\0') {
      return 0;
    }
LAB_00170ecc:
    if ((cm->seg).temporal_update != '\0') {
      if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)(*(ushort *)&xd->above_mbmi->field_0xa7 >> 3 & 1);
      }
      if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (ulong)(*(ushort *)&xd->left_mbmi->field_0xa7 >> 3 & 1);
      }
      uVar4 = aom_read_symbol_(r,(xd->tile_ctx->seg).pred_cdf[uVar5 + uVar6],2);
      *(ushort *)&pMVar1->field_0xa7 =
           (*(ushort *)&pMVar1->field_0xa7 & 0xfff7) + (short)(uVar4 & 1) * 8;
      if ((uVar4 & 1) != 0) {
        uVar4 = get_predicted_segment_id(cm,mi_offset,x_mis,y_mis);
        goto LAB_00170fce;
      }
    }
    skip = 0;
  }
  uVar4 = read_segment_id(cm,xd,r,skip);
LAB_00170fce:
  set_segment_id(cm->cur_frame->seg_map,mi_offset,x_mis,y_mis,iVar3,(uint8_t)uVar4);
  return uVar4 & 0xff;
}

Assistant:

static int read_inter_segment_id(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                                 int preskip, aom_reader *r) {
  struct segmentation *const seg = &cm->seg;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int mi_offset = mi_row * mi_params->mi_cols + mi_col;
  const int bw = mi_size_wide[mbmi->bsize];
  const int bh = mi_size_high[mbmi->bsize];

  // TODO(slavarnway): move x_mis, y_mis into xd ?????
  const int x_mis = AOMMIN(mi_params->mi_cols - mi_col, bw);
  const int y_mis = AOMMIN(mi_params->mi_rows - mi_row, bh);

  if (!seg->enabled) return 0;  // Default for disabled segmentation

  if (!seg->update_map) {
    copy_segment_id(mi_params, cm->last_frame_seg_map, cm->cur_frame->seg_map,
                    mi_offset, x_mis, y_mis);
    return get_predicted_segment_id(cm, mi_offset, x_mis, y_mis);
  }

  uint8_t segment_id;
  const int mi_stride = cm->mi_params.mi_cols;
  if (preskip) {
    if (!seg->segid_preskip) return 0;
  } else {
    if (mbmi->skip_txfm) {
      if (seg->temporal_update) {
        mbmi->seg_id_predicted = 0;
      }
      segment_id = read_segment_id(cm, xd, r, 1);
      set_segment_id(cm->cur_frame->seg_map, mi_offset, x_mis, y_mis, mi_stride,
                     segment_id);
      return segment_id;
    }
  }

  if (seg->temporal_update) {
    const uint8_t ctx = av1_get_pred_context_seg_id(xd);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    struct segmentation_probs *const segp = &ec_ctx->seg;
    aom_cdf_prob *pred_cdf = segp->pred_cdf[ctx];
    mbmi->seg_id_predicted = aom_read_symbol(r, pred_cdf, 2, ACCT_STR);
    if (mbmi->seg_id_predicted) {
      segment_id = get_predicted_segment_id(cm, mi_offset, x_mis, y_mis);
    } else {
      segment_id = read_segment_id(cm, xd, r, 0);
    }
  } else {
    segment_id = read_segment_id(cm, xd, r, 0);
  }
  set_segment_id(cm->cur_frame->seg_map, mi_offset, x_mis, y_mis, mi_stride,
                 segment_id);
  return segment_id;
}